

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::push_back
          (SmallVector<spirv_cross::Resource,_8UL> *this,Resource *t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  Resource *pRVar3;
  size_t sVar4;
  pointer pcVar5;
  undefined8 uVar6;
  TypeID TVar7;
  Resource *pRVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  
  reserve(this,(this->super_VectorView<spirv_cross::Resource>).buffer_size + 1);
  pRVar3 = (this->super_VectorView<spirv_cross::Resource>).ptr;
  sVar4 = (this->super_VectorView<spirv_cross::Resource>).buffer_size;
  pRVar8 = pRVar3 + sVar4;
  paVar9 = &(pRVar8->name).field_2;
  (pRVar8->base_type_id).id = (t->base_type_id).id;
  TVar7.id = (t->type_id).id;
  pRVar8->id = (ID)(t->id).id;
  pRVar8->type_id = (TypeID)TVar7.id;
  (pRVar8->name)._M_dataplus._M_p = (pointer)paVar9;
  pcVar5 = (t->name)._M_dataplus._M_p;
  paVar1 = &(t->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar6 = *(undefined8 *)((long)&(t->name).field_2 + 8);
    paVar9->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(pRVar8->name).field_2 + 8) = uVar6;
  }
  else {
    pRVar3[sVar4].name._M_dataplus._M_p = pcVar5;
    pRVar3[sVar4].name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  pRVar3[sVar4].name._M_string_length = (t->name)._M_string_length;
  (t->name)._M_dataplus._M_p = (pointer)paVar1;
  (t->name)._M_string_length = 0;
  (t->name).field_2._M_local_buf[0] = '\0';
  psVar2 = &(this->super_VectorView<spirv_cross::Resource>).buffer_size;
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}